

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

SolverParams *
make_solver_params_from_cmdline
          (SolverParams *__return_storage_ptr__,char **defines,int32_t num_defines)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int local_48;
  char *equal;
  char *value;
  char *name;
  int32_t i;
  int32_t num_defines_local;
  char **defines_local;
  
  memset(__return_storage_ptr__,0,0x1008);
  if (num_defines < 0x101) {
    name._0_4_ = 0;
    while( true ) {
      local_48 = num_defines;
      if (0x100 < num_defines) {
        local_48 = 0x100;
      }
      if (local_48 <= (int)name) break;
      pcVar1 = defines[(int)name];
      pcVar2 = strchr(defines[(int)name],0x3d);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = defines[(int)name];
        sVar3 = strlen(defines[(int)name]);
        equal = pcVar2 + sVar3;
      }
      else {
        *pcVar2 = '\0';
        equal = pcVar2 + 1;
      }
      __return_storage_ptr__->params[(int)name].name = pcVar1;
      __return_storage_ptr__->params[(int)name].value = equal;
      __return_storage_ptr__->num_params = __return_storage_ptr__->num_params + 1;
      name._0_4_ = (int)name + 1;
    }
    return __return_storage_ptr__;
  }
  fprintf(_stderr,"Too many parameters definitions, %d max, got %d instead",0x100,
          (ulong)(uint)num_defines);
  fflush(_stderr);
  abort();
}

Assistant:

static inline SolverParams
make_solver_params_from_cmdline(const char **defines, int32_t num_defines) {
    SolverParams result = {0};
    if (num_defines > MAX_NUM_SOLVER_PARAMS) {
        fprintf(stderr,
                "Too many parameters definitions, %d max, got %d instead",
                MAX_NUM_SOLVER_PARAMS, num_defines);
        fflush(stderr);
        abort();
    }

    for (int32_t i = 0; i < MIN(MAX_NUM_SOLVER_PARAMS, num_defines); i++) {
        const char *name = defines[i];
        const char *value = NULL;
        char *equal = strchr(defines[i], '=');
        if (equal) {
            *equal = 0;
            value = equal + 1;
        } else {
            value = defines[i] + strlen(defines[i]);
        }

        result.params[i].name = name;
        result.params[i].value = value;
        result.num_params++;
    }

    return result;
}